

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O0

void * alloc_small(j_common_ptr cinfo,int pool_id,size_t sizeofobject)

{
  jpeg_memory_mgr *pjVar1;
  size_t sVar2;
  _func_JBLOCKARRAY_j_common_ptr_int_JDIMENSION_JDIMENSION **pp_Var3;
  ulong local_58;
  size_t slop;
  size_t min_request;
  size_t odd_bytes;
  char *data_ptr;
  small_pool_ptr_conflict prev_hdr_ptr;
  small_pool_ptr_conflict hdr_ptr;
  my_mem_ptr mem;
  size_t sizeofobject_local;
  int pool_id_local;
  j_common_ptr cinfo_local;
  
  pjVar1 = cinfo->mem;
  if (0xffe8 < sizeofobject) {
    out_of_memory(cinfo,1);
  }
  mem = (my_mem_ptr)sizeofobject;
  if ((sizeofobject & 7) != 0) {
    mem = (my_mem_ptr)((8 - (sizeofobject & 7)) + sizeofobject);
  }
  if ((pool_id < 0) || (1 < pool_id)) {
    cinfo->err->msg_code = 0xf;
    (cinfo->err->msg_parm).i[0] = pool_id;
    (*cinfo->err->error_exit)(cinfo);
  }
  data_ptr = (char *)0x0;
  for (prev_hdr_ptr = (small_pool_ptr_conflict)(&pjVar1[1].alloc_small)[pool_id];
      (prev_hdr_ptr != (small_pool_ptr_conflict)0x0 &&
      ((my_mem_ptr)(prev_hdr_ptr->hdr).bytes_left < mem)); prev_hdr_ptr = (prev_hdr_ptr->hdr).next)
  {
    data_ptr = (char *)prev_hdr_ptr;
  }
  if (prev_hdr_ptr == (small_pool_ptr_conflict)0x0) {
    pp_Var3 = &(mem->pub).alloc_barray;
    if (data_ptr == (char *)0x0) {
      local_58 = first_pool_slop[pool_id];
    }
    else {
      local_58 = extra_pool_slop[pool_id];
    }
    if (0x10000U - (long)pp_Var3 < local_58) {
      local_58 = 0x10000 - (long)pp_Var3;
    }
    while (prev_hdr_ptr = (small_pool_ptr_conflict)jpeg_get_small(cinfo,(long)pp_Var3 + local_58),
          prev_hdr_ptr == (small_pool_ptr_conflict)0x0) {
      local_58 = local_58 >> 1;
      if (local_58 < 0x32) {
        out_of_memory(cinfo,2);
      }
    }
    pjVar1[1].realize_virt_arrays = pjVar1[1].realize_virt_arrays + (long)pp_Var3 + local_58;
    (prev_hdr_ptr->hdr).next = (small_pool_ptr)0x0;
    (prev_hdr_ptr->hdr).bytes_used = 0;
    (prev_hdr_ptr->hdr).bytes_left = (long)mem->small_list + (local_58 - 0x68);
    if (data_ptr == (char *)0x0) {
      (&pjVar1[1].alloc_small)[pool_id] = (_func_void_ptr_j_common_ptr_int_size_t *)prev_hdr_ptr;
    }
    else {
      *(small_pool_ptr_conflict *)data_ptr = prev_hdr_ptr;
    }
  }
  sVar2 = (prev_hdr_ptr->hdr).bytes_used;
  (prev_hdr_ptr->hdr).bytes_used = (long)mem->small_list + ((prev_hdr_ptr->hdr).bytes_used - 0x68);
  (prev_hdr_ptr->hdr).bytes_left = (prev_hdr_ptr->hdr).bytes_left - (long)mem;
  return (void *)((long)prev_hdr_ptr + sVar2 + 0x18);
}

Assistant:

METHODDEF(void *)
alloc_small (j_common_ptr cinfo, int pool_id, size_t sizeofobject)
/* Allocate a "small" object */
{
  my_mem_ptr mem = (my_mem_ptr) cinfo->mem;
  small_pool_ptr hdr_ptr, prev_hdr_ptr;
  char * data_ptr;
  size_t odd_bytes, min_request, slop;

  /* Check for unsatisfiable request (do now to ensure no overflow below) */
  if (sizeofobject > (size_t) (MAX_ALLOC_CHUNK-SIZEOF(small_pool_hdr)))
    out_of_memory(cinfo, 1);	/* request exceeds malloc's ability */

  /* Round up the requested size to a multiple of SIZEOF(ALIGN_TYPE) */
  odd_bytes = sizeofobject % SIZEOF(ALIGN_TYPE);
  if (odd_bytes > 0)
    sizeofobject += SIZEOF(ALIGN_TYPE) - odd_bytes;

  /* See if space is available in any existing pool */
  if (pool_id < 0 || pool_id >= JPOOL_NUMPOOLS)
    ERREXIT1(cinfo, JERR_BAD_POOL_ID, pool_id);	/* safety check */
  prev_hdr_ptr = NULL;
  hdr_ptr = mem->small_list[pool_id];
  while (hdr_ptr != NULL) {
    if (hdr_ptr->hdr.bytes_left >= sizeofobject)
      break;			/* found pool with enough space */
    prev_hdr_ptr = hdr_ptr;
    hdr_ptr = hdr_ptr->hdr.next;
  }

  /* Time to make a new pool? */
  if (hdr_ptr == NULL) {
    /* min_request is what we need now, slop is what will be leftover */
    min_request = sizeofobject + SIZEOF(small_pool_hdr);
    if (prev_hdr_ptr == NULL)	/* first pool in class? */
      slop = first_pool_slop[pool_id];
    else
      slop = extra_pool_slop[pool_id];
    /* Don't ask for more than MAX_ALLOC_CHUNK */
    if (slop > (size_t) (MAX_ALLOC_CHUNK-min_request))
      slop = (size_t) (MAX_ALLOC_CHUNK-min_request);
    /* Try to get space, if fail reduce slop and try again */
    for (;;) {
      hdr_ptr = (small_pool_ptr) jpeg_get_small(cinfo, min_request + slop);
      if (hdr_ptr != NULL)
	break;
      slop /= 2;
      if (slop < MIN_SLOP)	/* give up when it gets real small */
	out_of_memory(cinfo, 2); /* jpeg_get_small failed */
    }
    mem->total_space_allocated += min_request + slop;
    /* Success, initialize the new pool header and add to end of list */
    hdr_ptr->hdr.next = NULL;
    hdr_ptr->hdr.bytes_used = 0;
    hdr_ptr->hdr.bytes_left = sizeofobject + slop;
    if (prev_hdr_ptr == NULL)	/* first pool in class? */
      mem->small_list[pool_id] = hdr_ptr;
    else
      prev_hdr_ptr->hdr.next = hdr_ptr;
  }

  /* OK, allocate the object from the current pool */
  data_ptr = (char *) (hdr_ptr + 1); /* point to first data byte in pool */
  data_ptr += hdr_ptr->hdr.bytes_used; /* point to place for object */
  hdr_ptr->hdr.bytes_used += sizeofobject;
  hdr_ptr->hdr.bytes_left -= sizeofobject;

  return (void *) data_ptr;
}